

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall
miniros::MasterLink::setParamImpl<float>
          (MasterLink *this,string *key,vector<float,_std::allocator<float>_> *vec)

{
  XmlRpcValue *pXVar1;
  const_reference pvVar2;
  vector<float,_std::allocator<float>_> *in_RDX;
  double *rhs;
  size_t i;
  RpcValue xml_vec;
  RpcValue *in_stack_000000a0;
  string *in_stack_000000a8;
  MasterLink *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  XmlRpcValue *in_stack_ffffffffffffff90;
  XmlRpcValue *pXVar3;
  XmlRpcValue *this_00;
  XmlRpcValue local_28;
  vector<float,_std::allocator<float>_> *local_18;
  
  local_18 = in_RDX;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28);
  std::vector<float,_std::allocator<float>_>::size(local_18);
  XmlRpc::XmlRpcValue::setSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  pXVar3 = (XmlRpcValue *)0x0;
  while( true ) {
    this_00 = pXVar3;
    pXVar1 = (XmlRpcValue *)std::vector<float,_std::allocator<float>_>::size(local_18);
    if (pXVar1 <= pXVar3) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::at
                       ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff90,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    rhs = (double *)(double)*pvVar2;
    in_stack_ffffffffffffff90 =
         XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    XmlRpc::XmlRpcValue::operator=(this_00,rhs);
    pXVar3 = (XmlRpcValue *)((long)&this_00->_type + 1);
  }
  set(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45fe0c);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}